

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true> __thiscall
duckdb::QueryProfiler::CreateTree
          (QueryProfiler *this,PhysicalOperator *root_p,profiler_settings_t *settings,idx_t depth)

{
  ProfilingInfo *this_00;
  undefined8 uVar1;
  bool bVar2;
  ClientContext *pCVar3;
  pointer pPVar4;
  pointer pPVar5;
  mapped_type *this_01;
  idx_t in_R8;
  type pPVar6;
  pair<std::__detail::_Node_iterator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>,_false,_true>,_bool>
  pVar7;
  unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true> *node;
  __alloc_node_gen_t __alloc_node_gen_1;
  profiler_settings_t child_settings;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> children;
  _Head_base<0UL,_duckdb::ProfilingNode_*,_false> local_1e8;
  PhysicalOperator *local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [24];
  char local_1b0 [16];
  undefined1 local_1a0 [48];
  undefined1 local_170 [8];
  undefined1 local_168 [192];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a8;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  size_type sStack_40;
  undefined8 local_38;
  
  local_1e0 = root_p;
  bVar2 = OperatorRequiresProfiling(this,(PhysicalOperatorType)(settings->_M_h)._M_bucket_count);
  if (bVar2) {
    *(undefined1 *)
     &(local_1e0->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 1;
  }
  pCVar3 = (ClientContext *)operator_new(0x120);
  (pCVar3->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ProfilingNode_024a93f8;
  (pCVar3->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pCVar3->config;
  (pCVar3->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x1;
  (pCVar3->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&pCVar3->interrupted = 0;
  *(undefined4 *)
   &(pCVar3->registered_state).
    super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
    .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> = 0x3f800000;
  (pCVar3->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false> = (_Head_base<0UL,_duckdb::Logger_*,_false>)0x0;
  (pCVar3->config).home_directory._M_dataplus._M_p = (pointer)0x0;
  (pCVar3->config).home_directory._M_string_length =
       (size_type)&(pCVar3->config).profiler_save_location.field_2;
  (pCVar3->config).home_directory.field_2._M_allocated_capacity = 1;
  *(undefined8 *)((long)&(pCVar3->config).home_directory.field_2 + 8) = 0;
  (pCVar3->config).enable_profiler = false;
  (pCVar3->config).enable_detailed_profiling = false;
  (pCVar3->config).profiler_print_format = QUERY_TREE;
  *(undefined5 *)&(pCVar3->config).field_0x23 = 0;
  *(undefined4 *)&(pCVar3->config).profiler_save_location._M_dataplus._M_p = 0x3f800000;
  (pCVar3->config).profiler_save_location._M_string_length = 0;
  (pCVar3->config).profiler_save_location.field_2._M_allocated_capacity = 0;
  *(size_t **)((long)&(pCVar3->config).profiler_save_location.field_2 + 8) =
       &(pCVar3->config).profiler_settings._M_h._M_rehash_policy._M_next_resize;
  (pCVar3->config).profiler_settings._M_h._M_buckets = (__buckets_ptr)0x1;
  (pCVar3->config).profiler_settings._M_h._M_bucket_count = 0;
  (pCVar3->config).profiler_settings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  *(undefined4 *)&(pCVar3->config).profiler_settings._M_h._M_element_count = 0x3f800000;
  *(undefined8 *)&(pCVar3->config).profiler_settings._M_h._M_rehash_policy = 0;
  (pCVar3->config).profiler_settings._M_h._M_rehash_policy._M_next_resize = 0;
  (pCVar3->config).profiler_settings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(pCVar3->config).emit_profiler_output = 0;
  (pCVar3->config).system_progress_bar_disable_reason = (char *)0x0;
  *(idx_t **)&(pCVar3->config).enable_progress_bar = &(pCVar3->config).ordered_aggregate_threshold;
  *(undefined8 *)&(pCVar3->config).preserve_identifier_case = 1;
  (pCVar3->config).max_expression_depth = 0;
  (pCVar3->config).query_verification_enabled = false;
  (pCVar3->config).verify_external = false;
  (pCVar3->config).verify_fetch_row = false;
  (pCVar3->config).verify_serializer = false;
  (pCVar3->config).enable_optimizer = false;
  (pCVar3->config).enable_caching_operators = false;
  (pCVar3->config).verify_parallelism = false;
  (pCVar3->config).force_external = false;
  (pCVar3->config).force_no_cross_product = false;
  (pCVar3->config).force_asof_iejoin = false;
  (pCVar3->config).force_fetch_row = true;
  (pCVar3->config).prefer_range_joins = true;
  (pCVar3->config).perfect_ht_threshold = 0;
  (pCVar3->config).ordered_aggregate_threshold = 0;
  (pCVar3->config).partitioned_write_flush_threshold = 0;
  (pCVar3->config).partitioned_write_max_open_files = 0;
  (pCVar3->config).nested_loop_join_threshold = 0;
  (pCVar3->config).merge_join_threshold = 0;
  this->context = pCVar3;
  pPVar4 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
           operator->((unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                       *)this);
  ProfilingInfo::ProfilingInfo((ProfilingInfo *)local_168,(profiler_settings_t *)depth,in_R8);
  this_00 = &pPVar4->profiling_info;
  ProfilingInfo::operator=(this_00,(ProfilingInfo *)local_168);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_168 + 0xa8));
  ::std::
  _Hashtable<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_168 + 0x70));
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_168 + 0x38));
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_168);
  local_168._0_8_ = local_1a0;
  local_1a0._0_8_ = (pointer)0x0;
  local_1a0._8_8_ = ((_Head_base<0UL,_duckdb::ProfilingNode_*,_false> *)(depth + 8))->_M_head_impl;
  local_1a0._16_8_ = 0;
  local_1a0._24_8_ = *(undefined8 *)(depth + 0x18);
  local_1a0._32_8_ = *(undefined8 *)(depth + 0x20);
  local_1a0._40_8_ = *(size_type *)(depth + 0x28);
  local_170 = (undefined1  [8])0x0;
  ::std::
  _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::MetricsType,true>>>>
            ((_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_168._0_8_,
             (_Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)depth,(_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::MetricsType,_true>_>_>
                       *)local_168);
  if (in_R8 == 0) {
    local_1d8._0_8_ = local_68;
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = local_1a0._8_8_;
    local_68._16_8_ = 0;
    local_68._24_8_ = local_1a0._24_8_;
    local_48._M_p = (pointer)local_1a0._32_8_;
    sStack_40 = local_1a0._40_8_;
    local_38 = 0;
    ::std::
    _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::MetricsType,true>>>>
              ((_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1d8._0_8_,
               (_Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_1a0,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::MetricsType,_true>_>_> *
               )local_1d8);
    EraseQueryRootSettings((profiler_settings_t *)local_168,(profiler_settings_t *)local_68);
    ::std::
    _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_M_move_assign((_Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)local_1a0,local_168);
    ::std::
    _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_168);
    ::std::
    _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_68);
  }
  pPVar5 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
           operator->((unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                       *)this);
  pPVar5->depth = in_R8;
  if (in_R8 != 0) {
    (*(code *)(settings->_M_h)._M_buckets[2])(local_1c8 + 8,settings);
    Value::Value((Value *)local_168,(string *)(local_1c8 + 8));
    local_1d8[0] = 0xd;
    this_01 = ::std::__detail::
              _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&(pPVar4->profiling_info).metrics,local_1d8);
    Value::operator=(this_01,(Value *)local_168);
    Value::~Value((Value *)local_168);
    if ((char *)local_1c8._8_8_ != local_1b0) {
      operator_delete((void *)local_1c8._8_8_);
    }
    local_168[0] = (char)(settings->_M_h)._M_bucket_count;
    ProfilingInfo::MetricSum<unsigned_char>(this_00,OPERATOR_TYPE,local_168);
  }
  bVar2 = ProfilingInfo::Enabled(&this_00->settings,EXTRA_INFO);
  if (bVar2) {
    (*(code *)(settings->_M_h)._M_buckets[3])(local_168,settings);
    local_1d8._0_8_ =
         (pPVar4->profiling_info).extra_info.map.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1d8._8_8_ =
         *(pointer *)
          ((long)&(pPVar4->profiling_info).extra_info.map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data + 8);
    local_1c8._0_8_ =
         *(pointer *)
          ((long)&(pPVar4->profiling_info).extra_info.map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data + 0x10);
    (pPVar4->profiling_info).extra_info.map.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_168._0_8_;
    *(undefined8 *)
     ((long)&(pPVar4->profiling_info).extra_info.map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data + 8) = local_168._8_8_;
    *(undefined8 *)
     ((long)&(pPVar4->profiling_info).extra_info.map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data + 0x10) = local_168._16_8_;
    local_168._0_8_ = (pointer)0x0;
    local_168._8_8_ = (pointer)0x0;
    local_168._16_8_ = (pointer)0x0;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1d8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(pPVar4->profiling_info).extra_info.map_idx._M_h,
                     (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)(local_168 + 0x18));
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_168 + 0x18));
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_168);
  }
  local_168._8_8_ =
       unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
       operator*((unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                  *)this);
  local_168._0_8_ = settings;
  pVar7 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::ProfilingNode>>,std::allocator<std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::ProfilingNode>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::PhysicalOperator_const>,duckdb::ReferenceHashFunction<duckdb::PhysicalOperator_const>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<duckdb::PhysicalOperator_const&,duckdb::ProfilingNode&>>
                    ((_Hashtable<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::ProfilingNode>>,std::allocator<std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::ProfilingNode>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::PhysicalOperator_const>,duckdb::ReferenceHashFunction<duckdb::PhysicalOperator_const>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)((long)&local_1e0[2].lock.super___mutex_base._M_mutex + 0x20));
  (*(code *)(settings->_M_h)._M_buckets[5])(local_168,settings,pVar7._8_8_);
  uVar1 = local_168._8_8_;
  if (local_168._0_8_ != local_168._8_8_) {
    pPVar6 = (type)local_168._0_8_;
    do {
      CreateTree((QueryProfiler *)local_1d8,local_1e0,
                 (profiler_settings_t *)pPVar6->_vptr_ProfilingNode,(idx_t)local_1a0);
      pPVar4 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator->((unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                           *)this);
      local_1e8._M_head_impl = (ProfilingNode *)local_1d8._0_8_;
      local_1d8._0_8_ = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ProfilingNode,std::default_delete<duckdb::ProfilingNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,std::default_delete<duckdb::ProfilingNode>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ProfilingNode,std::default_delete<duckdb::ProfilingNode>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ProfilingNode,std::default_delete<duckdb::ProfilingNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,std::default_delete<duckdb::ProfilingNode>,true>>>
                  *)&pPVar4->children,
                 (unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                  *)&local_1e8);
      vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_true>
      ::back(&pPVar4->children);
      if (local_1e8._M_head_impl != (ProfilingNode *)0x0) {
        (**(code **)(*(long *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&(local_1e8._M_head_impl)->_vptr_ProfilingNode)->_M_dataplus + 8))
                  ();
      }
      local_1e8._M_head_impl = (ProfilingNode *)0x0;
      if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
        (**(code **)(*(long *)local_1d8._0_8_ + 8))();
      }
      pPVar6 = (type)&pPVar6->profiling_info;
    } while (pPVar6 != (type)uVar1);
  }
  if ((type)local_168._0_8_ != (type)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_1a0);
  return (unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>)
         (unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>)this;
}

Assistant:

unique_ptr<ProfilingNode> QueryProfiler::CreateTree(const PhysicalOperator &root_p, const profiler_settings_t &settings,
                                                    const idx_t depth) {
	if (OperatorRequiresProfiling(root_p.type)) {
		query_requires_profiling = true;
	}

	unique_ptr<ProfilingNode> node = make_uniq<ProfilingNode>();
	auto &info = node->GetProfilingInfo();
	info = ProfilingInfo(settings, depth);
	auto child_settings = settings;
	if (depth == 0) {
		child_settings = EraseQueryRootSettings(child_settings);
	}
	node->depth = depth;

	if (depth != 0) {
		info.metrics[MetricsType::OPERATOR_NAME] = root_p.GetName();
		info.MetricSum<uint8_t>(MetricsType::OPERATOR_TYPE, static_cast<uint8_t>(root_p.type));
	}
	if (info.Enabled(info.settings, MetricsType::EXTRA_INFO)) {
		info.extra_info = root_p.ParamsToString();
	}

	tree_map.insert(make_pair(reference<const PhysicalOperator>(root_p), reference<ProfilingNode>(*node)));
	auto children = root_p.GetChildren();
	for (auto &child : children) {
		auto child_node = CreateTree(child.get(), child_settings, depth + 1);
		node->AddChild(std::move(child_node));
	}
	return node;
}